

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corpus_test.cpp
# Opt level: O0

void __thiscall
crn::corpus_tester::print_metric_stats
          (corpus_tester *this,vector<crnlib::image_utils::error_metrics> *stats,uint num_blocks_x,
          uint num_blocks_y)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  error_metrics *this_00;
  uint *puVar4;
  double dVar5;
  double dVar6;
  double psnr_std_dev;
  error_metrics *em;
  uint by;
  uint bx;
  uint i;
  uint num_inf;
  uint num_non_inf;
  double psnr2_total;
  double psnr_total;
  vec2I worst_loc;
  vec2I best_loc;
  error_metrics worst_metrics;
  error_metrics best_metrics;
  uint num_blocks_y_local;
  uint num_blocks_x_local;
  vector<crnlib::image_utils::error_metrics> *stats_local;
  corpus_tester *this_local;
  
  crnlib::image_utils::error_metrics::error_metrics((error_metrics *)&worst_metrics.mPeakSNR);
  crnlib::image_utils::error_metrics::error_metrics((error_metrics *)&best_loc);
  worst_metrics.mRootMeanSquared = 1000000.0;
  crnlib::vec<2U,_int>::vec(&worst_loc);
  crnlib::vec<2U,_int>::vec((vec<2U,_int> *)&psnr_total);
  crnlib::utils::zero_object<crnlib::vec<2u,int>>(&worst_loc);
  crnlib::utils::zero_object<crnlib::vec<2u,int>>((vec<2U,_int> *)&psnr_total);
  psnr2_total = 0.0;
  _num_inf = 0.0;
  i = 0;
  bx = 0;
  for (by = 0; uVar3 = crnlib::vector<crnlib::image_utils::error_metrics>::size(stats), by < uVar3;
      by = by + 1) {
    this_00 = crnlib::vector<crnlib::image_utils::error_metrics>::operator[](stats,by);
    if ((this_00->mPeakSNR <= 200.0 && this_00->mPeakSNR != 200.0) &&
       (bVar2 = crnlib::image_utils::error_metrics::operator>
                          (this_00,(error_metrics *)&worst_metrics.mPeakSNR), bVar2)) {
      memcpy(&worst_metrics.mPeakSNR,this_00,0x28);
      crnlib::vec<2U,_int>::set(&worst_loc,by % num_blocks_x,by / num_blocks_x);
    }
    bVar2 = crnlib::image_utils::error_metrics::operator<(this_00,(error_metrics *)&best_loc);
    if (bVar2) {
      memcpy(&best_loc,this_00,0x28);
      crnlib::vec<2U,_int>::set((vec<2U,_int> *)&psnr_total,by % num_blocks_x,by / num_blocks_x);
    }
    if (200.0 < this_00->mPeakSNR || this_00->mPeakSNR == 200.0) {
      bx = bx + 1;
    }
    else {
      psnr2_total = this_00->mPeakSNR + psnr2_total;
      _num_inf = this_00->mPeakSNR * this_00->mPeakSNR + _num_inf;
      i = i + 1;
    }
  }
  crnlib::console::printf("Number of infinite PSNR blocks: %u",(ulong)bx);
  crnlib::console::printf("Number of non-infinite PSNR blocks: %u");
  if (i != 0) {
    dVar5 = psnr2_total / (double)i;
    dVar6 = sqrt(-dVar5 * dVar5 + _num_inf / (double)i);
    crnlib::console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f",dVar5,dVar6);
    dVar5 = worst_metrics.mRootMeanSquared;
    puVar4 = (uint *)crnlib::vec<2U,_int>::operator[]((vec<2U,_int> *)&psnr_total,0);
    uVar1 = *puVar4;
    puVar4 = (uint *)crnlib::vec<2U,_int>::operator[]((vec<2U,_int> *)&psnr_total,1);
    crnlib::console::printf
              ("Worst PSNR: %3.3f, Block Location: %i,%i",dVar5,(ulong)uVar1,(ulong)*puVar4);
    puVar4 = (uint *)crnlib::vec<2U,_int>::operator[](&worst_loc,0);
    uVar1 = *puVar4;
    puVar4 = (uint *)crnlib::vec<2U,_int>::operator[](&worst_loc,1);
    crnlib::console::printf
              ("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i",best_metrics.mRootMeanSquared,
               (ulong)uVar1,(ulong)*puVar4);
  }
  return;
}

Assistant:

void corpus_tester::print_metric_stats(const crnlib::vector<image_utils::error_metrics>& stats, uint num_blocks_x, uint num_blocks_y)
    {
        num_blocks_y;

        image_utils::error_metrics best_metrics;
        image_utils::error_metrics worst_metrics;
        worst_metrics.mPeakSNR = 1e+6f;

        vec2I best_loc;
        vec2I worst_loc;
        utils::zero_object(best_loc);
        utils::zero_object(worst_loc);

        double psnr_total = 0.0f;
        double psnr2_total = 0.0f;
        uint num_non_inf = 0;
        uint num_inf = 0;

        for (uint i = 0; i < stats.size(); i++)
        {
            uint bx = i % num_blocks_x;
            uint by = i / num_blocks_x;

            const image_utils::error_metrics& em = stats[i];

            if ((em.mPeakSNR < 200.0f) && (em > best_metrics))
            {
                best_metrics = em;
                best_loc.set(bx, by);
            }
            if (em < worst_metrics)
            {
                worst_metrics = em;
                worst_loc.set(bx, by);
            }

            if (em.mPeakSNR < 200.0f)
            {
                psnr_total += em.mPeakSNR;
                psnr2_total += em.mPeakSNR * em.mPeakSNR;
                num_non_inf++;
            }
            else
            {
                num_inf++;
            }
        }

        console::printf("Number of infinite PSNR blocks: %u", num_inf);
        console::printf("Number of non-infinite PSNR blocks: %u", num_non_inf);
        if (num_non_inf)
        {
            psnr_total /= num_non_inf;
            psnr2_total /= num_non_inf;

            double psnr_std_dev = sqrt(psnr2_total - psnr_total * psnr_total);

            console::printf("Average Non-Inf PSNR: %3.3f, Std dev: %3.3f", psnr_total, psnr_std_dev);
            console::printf("Worst PSNR: %3.3f, Block Location: %i,%i", worst_metrics.mPeakSNR, worst_loc[0], worst_loc[1]);
            console::printf("Best Non-Inf PSNR: %3.3f, Block Location: %i,%i", best_metrics.mPeakSNR, best_loc[0], best_loc[1]);
        }
    }